

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

Gia_Man_t * Gia_ManSpecReduceInit(Gia_Man_t *p,Abc_Cex_t *pInit,int nFrames,int fDualOut)

{
  int *__ptr;
  int iVar1;
  int iLit;
  int iVar2;
  ulong uVar3;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar6;
  ulong uVar7;
  uint uVar8;
  int f;
  int iVar9;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    pcVar4 = "Gia_ManSpecReduceInit(): Equivalence classes are not available.\n";
  }
  else {
    iVar9 = p->nRegs;
    if (iVar9 == 0) {
      pcVar4 = "Gia_ManSpecReduceInit(): Circuit is not sequential.\n";
    }
    else if (iVar9 == pInit->nRegs) {
      if ((fDualOut == 0) || ((p->vCos->nSize - iVar9 & 1U) == 0)) {
        if (pInit->nPis != 0) {
          __assert_fail("pInit->nRegs == Gia_ManRegNum(p) && pInit->nPis == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x553,
                        "Gia_Man_t *Gia_ManSpecReduceInit(Gia_Man_t *, Abc_Cex_t *, int, int)");
        }
        uVar8 = p->nObjs * nFrames;
        Vec_IntGrow(&p->vCopies,uVar8);
        uVar3 = 0;
        uVar7 = 0;
        if (0 < (int)uVar8) {
          uVar7 = (ulong)uVar8;
        }
        for (; uVar7 != uVar3; uVar3 = uVar3 + 1) {
          (p->vCopies).pArray[uVar3] = -1;
        }
        (p->vCopies).nSize = uVar8;
        p_00 = Vec_IntAlloc(1000);
        Gia_ManSetPhase(p);
        if (fDualOut != 0) {
          Gia_ManEquivSetColors(p,0);
        }
        p_01 = Gia_ManStart(p->nObjs * nFrames);
        pcVar4 = Abc_UtilStrsav(p->pName);
        p_01->pName = pcVar4;
        pcVar4 = Abc_UtilStrsav(p->pSpec);
        p_01->pSpec = pcVar4;
        Gia_ManHashAlloc(p_01);
        uVar3 = 0;
        while( true ) {
          uVar8 = (uint)uVar3;
          if ((p->nRegs <= (int)uVar8) ||
             (pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + uVar8), pGVar5 == (Gia_Obj_t *)0x0)
             ) break;
          Gia_ObjSetCopyF(p,0,pGVar5,
                          (uint)(((uint)(&pInit[1].iPo)[uVar3 >> 5] >> (uVar8 & 0x1f) & 1) != 0));
          uVar3 = (ulong)(uVar8 + 1);
        }
        iVar9 = 0;
        iVar2 = nFrames;
        if (nFrames < 1) {
          iVar2 = 0;
        }
        while (f = iVar9, f != iVar2) {
          iVar9 = 0;
          Gia_ObjSetCopyF(p,f,p->pObjs,0);
          while ((iVar9 < p->vCis->nSize - p->nRegs &&
                 (pGVar5 = Gia_ManCi(p,iVar9), pGVar5 != (Gia_Obj_t *)0x0))) {
            iVar1 = Gia_ManAppendCi(p_01);
            Gia_ObjSetCopyF(p,f,pGVar5,iVar1);
            iVar9 = iVar9 + 1;
          }
          iVar9 = 0;
          while ((iVar9 < p->nRegs &&
                 (pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar9),
                 pGVar5 != (Gia_Obj_t *)0x0))) {
            Gia_ManSpecBuildInit(p_01,p,pGVar5,p_00,f,fDualOut);
            iVar9 = iVar9 + 1;
          }
          iVar9 = 0;
          while ((iVar9 < p->vCos->nSize &&
                 (pGVar5 = Gia_ManCo(p,iVar9), pGVar5 != (Gia_Obj_t *)0x0))) {
            Gia_ManSpecReduceInit_rec
                      (p_01,p,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff),p_00,f,
                       fDualOut);
            iVar1 = Gia_ObjFanin0CopyF(p,f,pGVar5);
            Gia_ObjSetCopyF(p,f,pGVar5,iVar1);
            iVar9 = iVar9 + 1;
          }
          if (f == nFrames + -1) break;
          iVar9 = f + 1;
          iVar1 = 0;
          while (((iVar1 < p->nRegs &&
                  (pGVar5 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar1),
                  pGVar5 != (Gia_Obj_t *)0x0)) &&
                 (pObj = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar1), pObj != (Gia_Obj_t *)0x0)
                 )) {
            iLit = Gia_ObjCopyF(p,f,pGVar5);
            Gia_ObjSetCopyF(p,iVar9,pObj,iLit);
            iVar1 = iVar1 + 1;
          }
        }
        for (iVar9 = 0; iVar9 < p_00->nSize; iVar9 = iVar9 + 1) {
          iVar2 = Vec_IntEntry(p_00,iVar9);
          Gia_ManAppendCo(p_01,iVar2);
        }
        if (p_00->nSize == 0) {
          Gia_ManAppendCo(p_01,0);
        }
        __ptr = (p->vCopies).pArray;
        if (__ptr != (int *)0x0) {
          free(__ptr);
          (p->vCopies).pArray = (int *)0x0;
        }
        (p->vCopies).nCap = 0;
        (p->vCopies).nSize = 0;
        Vec_IntFree(p_00);
        Gia_ManHashStop(p_01);
        pGVar6 = Gia_ManCleanup(p_01);
        Gia_ManStop(p_01);
        return pGVar6;
      }
      pcVar4 = "Gia_ManSpecReduceInit(): Dual-output miter should have even number of POs.\n";
    }
    else {
      pcVar4 = "Gia_ManSpecReduceInit(): Mismatch in the number of registers.\n";
    }
  }
  Abc_Print(1,pcVar4);
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduceInit( Gia_Man_t * p, Abc_Cex_t * pInit, int nFrames, int fDualOut )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    Vec_Int_t * vXorLits;
    int f, i, iLitNew;
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Equivalence classes are not available.\n" );
        return NULL;
    }
    if ( Gia_ManRegNum(p) == 0 )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Circuit is not sequential.\n" );
        return NULL;
    }
    if ( Gia_ManRegNum(p) != pInit->nRegs )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Mismatch in the number of registers.\n" );
        return NULL;
    }
    if ( fDualOut && (Gia_ManPoNum(p) & 1) )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): Dual-output miter should have even number of POs.\n" );
        return NULL;
    }

/*
    if ( !Gia_ManCheckTopoOrder( p ) )
    {
        Abc_Print( 1, "Gia_ManSpecReduceInit(): AIG is not in a correct topological order.\n" );
        return NULL;
    }
*/
    assert( pInit->nRegs == Gia_ManRegNum(p) && pInit->nPis == 0 );
    Vec_IntFill( &p->vCopies, nFrames * Gia_ManObjNum(p), -1 );
    vXorLits = Vec_IntAlloc( 1000 );
    Gia_ManSetPhase( p );
    if ( fDualOut )
        Gia_ManEquivSetColors( p, 0 );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, Abc_InfoHasBit(pInit->pData, i) );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
        Gia_ManForEachRo( p, pObj, i )
            Gia_ManSpecBuildInit( pNew, p, pObj, vXorLits, f, fDualOut );
        Gia_ManForEachCo( p, pObj, i )
        {
            Gia_ManSpecReduceInit_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, f, fDualOut );
            Gia_ObjSetCopyF( p, f, pObj, Gia_ObjFanin0CopyF(p, f, pObj) );
        }
        if ( f == nFrames - 1 )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Gia_ObjSetCopyF( p, f+1, pObjRo, Gia_ObjCopyF(p, f, pObjRi) );
    }
    Vec_IntForEachEntry( vXorLits, iLitNew, i )
        Gia_ManAppendCo( pNew, iLitNew );
    if ( Vec_IntSize(vXorLits) == 0 )
    {
//        Abc_Print( 1, "Speculatively reduced model has no primary outputs.\n" );
        Gia_ManAppendCo( pNew, 0 );
    }
    Vec_IntErase( &p->vCopies );
    Vec_IntFree( vXorLits );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}